

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddColorDiagnosticsFlags(cmLocalGenerator *this,string *flags,string *lang)

{
  cmMakefile *this_00;
  size_type sVar1;
  bool bVar2;
  cmValue cVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar4;
  char *extraout_RDX_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *option;
  _Alloc_hider _Var5;
  string_view value;
  string_view value_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string colorFlagName;
  string local_98;
  undefined8 local_78;
  char *local_70;
  string local_68;
  string local_48;
  
  this_00 = this->Makefile;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CMAKE_COLOR_DIAGNOSTICS","");
  cVar3 = cmMakefile::GetDefinition(this_00,&local_98);
  pcVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    pcVar4 = extraout_RDX_00;
  }
  if ((cVar3.Value != (string *)0x0) &&
     ((cmValue *)(cVar3.Value)->_M_string_length != (cmValue *)0x0)) {
    value._M_str = pcVar4;
    value._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
    bVar2 = cmValue::IsNOTFOUND((cmValue *)(cVar3.Value)->_M_string_length,value);
    if (!bVar2) {
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      value_00._M_str = extraout_RDX_01;
      value_00._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      bVar2 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value_00);
      if (bVar2) {
        local_98.field_2._8_8_ = (lang->_M_dataplus)._M_p;
        local_98.field_2._M_allocated_capacity = lang->_M_string_length;
        local_98._M_dataplus._M_p = (pointer)0x6;
        local_98._M_string_length = 0x7cc7b3;
        local_78 = 0x22;
        local_70 = "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS";
        views._M_len = 3;
        views._M_array = (iterator)&local_98;
        cmCatViews_abi_cxx11_(&local_68,views);
      }
      else {
        local_98.field_2._8_8_ = (lang->_M_dataplus)._M_p;
        local_98.field_2._M_allocated_capacity = lang->_M_string_length;
        local_98._M_dataplus._M_p = (pointer)0x6;
        local_98._M_string_length = 0x7cc7b3;
        local_78 = 0x26;
        local_70 = "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS_OFF";
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_98;
        cmCatViews_abi_cxx11_(&local_68,views_00);
      }
      std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      cmMakefile::GetDefExpandList
                (this->Makefile,&local_48,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_98,false);
      sVar1 = local_98._M_string_length;
      for (_Var5._M_p = local_98._M_dataplus._M_p; _Var5._M_p != (pointer)sVar1;
          _Var5._M_p = _Var5._M_p + 0x20) {
        (*this->_vptr_cmLocalGenerator[8])(this,flags,_Var5._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AddColorDiagnosticsFlags(std::string& flags,
                                                const std::string& lang)
{
  cmValue diag = this->Makefile->GetDefinition("CMAKE_COLOR_DIAGNOSTICS");
  if (diag.IsSet()) {
    std::string colorFlagName;
    if (diag.IsOn()) {
      colorFlagName =
        cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS");
    } else {
      colorFlagName =
        cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS_OFF");
    }

    std::vector<std::string> options;
    this->Makefile->GetDefExpandList(colorFlagName, options);

    for (std::string const& option : options) {
      this->AppendFlagEscape(flags, option);
    }
  }
}